

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vttdemux.cc
# Opt level: O0

bool libwebm::vttdemux::WriteCueIdentifier(FILE *f,FrameParser *parser)

{
  int iVar1;
  ulong uVar2;
  char *__s;
  undefined1 local_40 [4];
  int e;
  string line;
  FrameParser *parser_local;
  FILE *f_local;
  
  line.field_2._8_8_ = parser;
  std::__cxx11::string::string((string *)local_40);
  iVar1 = libwebvtt::LineReader::GetLine((LineReader *)line.field_2._8_8_,(string *)local_40);
  if (iVar1 != 0) {
    f_local._7_1_ = false;
    goto LAB_0011ab46;
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    __s = (char *)std::__cxx11::string::c_str();
    iVar1 = fputs(__s,(FILE *)f);
    if (iVar1 < 0) {
      f_local._7_1_ = false;
      goto LAB_0011ab46;
    }
    iVar1 = fputc(10,(FILE *)f);
    if (iVar1 < 0) {
      f_local._7_1_ = false;
      goto LAB_0011ab46;
    }
  }
  f_local._7_1_ = true;
LAB_0011ab46:
  std::__cxx11::string::~string((string *)local_40);
  return f_local._7_1_;
}

Assistant:

bool vttdemux::WriteCueIdentifier(FILE* f, FrameParser* parser) {
  string line;
  int e = parser->GetLine(&line);

  if (e)  // error or EOS
    return false;

  // If the cue identifier line is empty, this means that the original
  // WebVTT cue did not have a cue identifier, so we don't bother
  // writing an extra line terminator to the output file (though doing
  // so would be harmless).

  if (!line.empty()) {
    if (fputs(line.c_str(), f) < 0)
      return false;

    if (fputc('\n', f) < 0)
      return false;
  }

  return true;
}